

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::cbtArcSegmentCollisionAlgorithm::processCollision
          (cbtArcSegmentCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  bool bVar1;
  cbtPersistentManifold *this_00;
  cbtCollisionShape *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionObject *pcVar4;
  cbtCollisionShape *pcVar5;
  float fVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  cbtTransform *this_01;
  cbtCollisionObjectWrapper *pcVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar31 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined8 uVar30;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar43 [56];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  cbtVector3 cVar46;
  cbtScalar seg_length;
  cbtVector3 local_P2;
  cbtVector3 local_CP2;
  cbtVector3 normal_on_2;
  cbtVector3 pos2;
  cbtVector3 local_seg_S2S1;
  undefined8 local_148;
  float local_12c;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  double local_e8;
  undefined8 uStack_e0;
  cbtCollisionShape *local_d0;
  undefined1 local_c8 [16];
  cbtVector3 local_b8;
  cbtVector3 local_a8;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  cbtVector3 local_70;
  cbtMatrix3x3 local_60;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_c8._8_8_ = local_c8._0_8_;
  uStack_100 = local_108;
  this_00 = this->m_manifoldPtr;
  if (this_00 == (cbtPersistentManifold *)0x0) {
    return;
  }
  bVar1 = this->m_isSwapped;
  resultOut->m_manifoldPtr = this_00;
  pcVar12 = body1;
  if (bVar1 != false) {
    pcVar12 = body0;
    body0 = body1;
  }
  cbtPersistentManifold::clearManifold(this_00);
  pcVar2 = body0->m_shape;
  if ((char)pcVar2[2].m_userIndex != '\0') {
    return;
  }
  pcVar3 = body0->m_collisionObject;
  pcVar4 = pcVar12->m_collisionObject;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[2] *
                                          (pcVar4->m_worldTransform).m_basis.m_el[1].m_floats[2])),
                            ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[2]),
                            ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[0].m_floats[2]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].
                                                  m_floats[2]),
                            ZEXT416((uint)(pcVar4->m_worldTransform).m_basis.m_el[2].m_floats[2]));
  auVar45._8_4_ = 0x7fffffff;
  auVar45._0_8_ = 0x7fffffff7fffffff;
  auVar45._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(auVar13,auVar45);
  auVar43 = ZEXT856(0);
  if (auVar13._0_4_ < 0.99) {
    return;
  }
  pcVar5 = pcVar12->m_shape;
  this_01 = &pcVar4->m_worldTransform;
  cVar46 = cbtTransform::invXform(this_01,&(pcVar3->m_worldTransform).m_origin);
  auVar34._0_8_ = cVar46.m_floats._8_8_;
  auVar34._8_56_ = auVar43;
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(auVar34._0_16_,auVar13);
  auVar43 = (undefined1  [56])0x0;
  if (*(float *)&pcVar2[2].field_0x1c + *(float *)((long)&pcVar5[3]._vptr_cbtCollisionShape + 4) <
      auVar13._0_4_) {
    return;
  }
  auVar31 = ZEXT856(0);
  local_b8.m_floats[2] = 0.0;
  local_b8.m_floats[3] = 0.0;
  local_b8.m_floats._0_8_ = *(ulong *)((long)&pcVar2[2]._vptr_cbtCollisionShape + 4);
  local_d0 = pcVar5;
  cVar46 = cbtTransform::operator()(&pcVar3->m_worldTransform,&local_b8);
  auVar35._0_8_ = cVar46.m_floats._8_8_;
  auVar35._8_56_ = auVar43;
  auVar20._0_8_ = cVar46.m_floats._0_8_;
  auVar20._8_56_ = auVar31;
  local_60.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar20._0_16_,auVar35._0_16_);
  uVar30 = local_60.m_el[0].m_floats._8_8_;
  cVar46 = cbtTransform::invXform(this_01,local_60.m_el);
  auVar36._0_8_ = cVar46.m_floats._8_8_;
  auVar36._8_56_ = auVar43;
  local_128._0_4_ = cVar46.m_floats[0];
  local_128._4_4_ = cVar46.m_floats[1];
  fStack_120 = (float)uVar30;
  fStack_11c = (float)((ulong)uVar30 >> 0x20);
  local_118 = auVar36._0_16_;
  cbtMatrix3x3::transpose(&local_60,&this_01->m_basis);
  auVar31 = (undefined1  [56])0x0;
  local_a8.m_floats = SUB6416(ZEXT464(0x3f800000),0);
  cVar46 = ::operator*(&(pcVar3->m_worldTransform).m_basis,&local_a8);
  pcVar5 = local_d0;
  auVar37._0_8_ = cVar46.m_floats._8_8_;
  auVar37._8_56_ = auVar43;
  auVar21._0_8_ = cVar46.m_floats._0_8_;
  auVar21._8_56_ = auVar31;
  local_b8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar37._0_16_);
  auVar43 = ZEXT856(local_b8.m_floats._8_8_);
  cVar46 = ::operator*(&local_60,&local_b8);
  auVar22._0_8_ = cVar46.m_floats._0_8_;
  auVar22._8_56_ = auVar43;
  auVar13 = vmovshdup_avx(auVar22._0_16_);
  local_f8._0_4_ = atan2f(auVar13._0_4_,cVar46.m_floats[0]);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)((long)&pcVar5[2]._vptr_cbtCollisionShape + 4);
  local_e8 = *(double *)&pcVar5[2].field_0xc;
  uStack_e0 = 0;
  local_108 = (undefined1  [8])(double)*(float *)&pcVar2[2].m_userPointer;
  local_c8._0_8_ = (double)*(float *)((long)&pcVar2[2].m_userPointer + 4);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)((long)&pcVar5[2].m_userPointer + 4);
  auVar13 = vsubps_avx(auVar17,auVar32);
  local_60.m_el[0].m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar13,ZEXT416((uint)(*(float *)&pcVar5[2].field_0x1c - SUB84(local_e8,0))),
                     0x28);
  local_12c = cbtVector3::length(local_60.m_el);
  auVar43 = ZEXT856(0);
  if (local_12c < 1e-30) {
    return;
  }
  local_e8 = (double)CONCAT44(local_e8._4_4_,(float)local_118._0_4_ - local_e8._0_4_);
  auVar9._4_4_ = local_128._4_4_;
  auVar9._0_4_ = (float)local_128;
  auVar9._8_4_ = fStack_120;
  auVar9._12_4_ = fStack_11c;
  auVar45 = vsubps_avx(auVar9,auVar32);
  auVar31 = ZEXT856(auVar45._8_8_);
  cVar46 = ::operator/(local_60.m_el,&local_12c);
  auVar38._0_8_ = cVar46.m_floats._8_8_;
  auVar38._8_56_ = auVar43;
  auVar23._0_8_ = cVar46.m_floats._0_8_;
  auVar23._8_56_ = auVar31;
  auVar44._0_4_ = auVar45._0_4_ * cVar46.m_floats[0];
  auVar44._4_4_ = auVar45._4_4_ * cVar46.m_floats[1];
  auVar44._8_4_ = auVar45._8_4_ * auVar31._0_4_;
  auVar44._12_4_ = auVar45._12_4_ * auVar31._4_4_;
  auVar13 = vmovshdup_avx(auVar44);
  auVar13 = vfmadd231ss_fma(auVar13,auVar23._0_16_,auVar45);
  auVar13 = vfmadd231ss_fma(auVar13,auVar38._0_16_,ZEXT416((uint)local_e8._0_4_));
  fVar14 = auVar13._0_4_;
  if (fVar14 < 0.0) {
    return;
  }
  if (local_12c < fVar14) {
    return;
  }
  uVar30 = *(undefined8 *)((long)&pcVar5[2]._vptr_cbtCollisionShape + 4);
  fVar6 = cVar46.m_floats[2] * fVar14 + *(float *)&pcVar5[2].field_0xc;
  local_e8 = (double)(float)local_f8._0_4_ + (double)local_108;
  dVar15 = (double)(float)local_f8._0_4_ + (double)local_c8._0_8_;
  auVar18._0_4_ = cVar46.m_floats[0] * fVar14 + (float)uVar30;
  auVar18._4_4_ = cVar46.m_floats[1] * fVar14 + (float)((ulong)uVar30 >> 0x20);
  auVar18._8_4_ = auVar31._0_4_ * fVar14 + 0.0;
  auVar18._12_4_ = auVar31._4_4_ * fVar14 + 0.0;
  local_b8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar18,ZEXT416((uint)fVar6),0x28);
  auVar10._4_4_ = local_128._4_4_;
  auVar10._0_4_ = (float)local_128;
  auVar10._8_4_ = fStack_120;
  auVar10._12_4_ = fStack_11c;
  auVar13 = vsubps_avx(auVar10,auVar18);
  auVar31 = (undefined1  [56])0x0;
  auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)((float)local_118._0_4_ - fVar6)),0x28);
  uVar30 = auVar13._8_8_;
  local_a8.m_floats[3] = auVar13._12_4_;
  local_a8.m_floats._0_8_ = auVar13._0_8_;
  local_a8.m_floats[2] = 0.0;
  cVar46 = cbtVector3::normalized(&local_a8);
  fVar14 = *(float *)&pcVar2[2].field_0xc;
  local_108._4_4_ = fVar14 * cVar46.m_floats[1];
  local_108._0_4_ = fVar14 * cVar46.m_floats[0];
  uStack_100._0_4_ = fVar14 * (float)uVar30;
  uStack_100._4_4_ = fVar14 * (float)((ulong)uVar30 >> 0x20);
  auVar43 = (undefined1  [56])0x0;
  local_f8._0_4_ = fVar14 * cVar46.m_floats[2];
  cVar46 = cbtVector3::cross(local_60.m_el,&local_a8);
  auVar39._0_8_ = cVar46.m_floats._8_8_;
  auVar39._8_56_ = auVar31;
  local_c8 = auVar39._0_16_;
  cVar46 = cbtVector3::normalized(&local_a8);
  auVar40._0_8_ = cVar46.m_floats._8_8_;
  auVar40._8_56_ = auVar31;
  auVar13 = auVar40._0_16_;
  auVar24._0_8_ = cVar46.m_floats._0_8_;
  auVar24._8_56_ = auVar43;
  auVar19 = auVar24._0_16_;
  if ((float)local_c8._0_4_ <= 0.0) {
    auVar45 = ZEXT816(0) << 0x20;
    auVar33._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar33._8_4_ = auVar31._0_4_ ^ 0x80000000;
    auVar33._12_4_ = auVar31._4_4_ ^ 0x80000000;
    auVar19._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
    auVar19._8_4_ = auVar43._0_4_ ^ 0x80000000;
    auVar19._12_4_ = auVar43._4_4_ ^ 0x80000000;
    auVar13 = vblendps_avx(auVar33,auVar45,2);
    local_108._4_4_ = (float)local_108._4_4_ + local_128._4_4_;
    local_108._0_4_ = (float)local_108._0_4_ + (float)local_128;
    uStack_100._0_4_ = (float)uStack_100 + fStack_120;
    uStack_100._4_4_ = uStack_100._4_4_ + fStack_11c;
    local_f8._0_4_ = (float)local_f8._0_4_ + (float)local_118._0_4_;
  }
  else {
    auVar11._4_4_ = local_128._4_4_;
    auVar11._0_4_ = (float)local_128;
    auVar11._8_4_ = fStack_120;
    auVar11._12_4_ = fStack_11c;
    auVar45 = ZEXT816(0);
    _local_108 = vsubps_avx(auVar11,_local_108);
    local_f8._0_4_ = (float)local_118._0_4_ - (float)local_f8._0_4_;
  }
  local_f8._4_12_ = auVar45._4_12_;
  local_70.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19,auVar13);
  auVar13 = vmovshdup_avx(auVar19);
  fVar14 = atan2f(-auVar13._0_4_,-auVar19._0_4_);
  local_118._0_8_ = (double)fVar14;
  auVar25._0_8_ = fmod(local_e8 + 1e-30,6.283185307179586);
  auVar25._8_56_ = extraout_var;
  uVar30 = vcmpsd_avx512f(auVar25._0_16_,ZEXT816(0) << 0x40,1);
  bVar1 = (bool)((byte)uVar30 & 1);
  local_128 = (double)((ulong)bVar1 * (long)(auVar25._0_8_ + 6.283185307179586) +
                      (ulong)!bVar1 * (long)auVar25._0_8_);
  fStack_120 = extraout_var._0_4_;
  fStack_11c = extraout_var._4_4_;
  auVar26._0_8_ = fmod(dVar15 + 1e-30,6.283185307179586);
  auVar26._8_56_ = extraout_var_00;
  uVar30 = vcmpsd_avx512f(auVar26._0_16_,ZEXT816(0),1);
  bVar1 = (bool)((byte)uVar30 & 1);
  auVar27._0_8_ = fmod((double)local_118._0_8_,6.283185307179586);
  auVar27._8_56_ = extraout_var_01;
  uVar30 = vcmpsd_avx512f(auVar27._0_16_,ZEXT816(0),1);
  bVar7 = (bool)((byte)uVar30 & 1);
  local_118._8_8_ = extraout_var_01._0_8_;
  local_118._0_8_ =
       (ulong)bVar7 * (long)(auVar27._0_8_ + 6.283185307179586) +
       (ulong)!bVar7 * (long)auVar27._0_8_;
  dVar15 = fmod(local_128,6.283185307179586);
  local_128._0_4_ = SUB84(dVar15,0);
  local_128._4_4_ = (cbtScalar)((ulong)dVar15 >> 0x20);
  dVar15 = fmod((double)((ulong)bVar1 * (long)(auVar26._0_8_ + 6.283185307179586) +
                        (ulong)!bVar1 * (long)auVar26._0_8_),6.283185307179586);
  dVar16 = fmod((double)local_118._0_8_,6.283185307179586);
  auVar43 = ZEXT856(0);
  if (dVar15 <= (double)CONCAT44(local_128._4_4_,(float)local_128)) {
    if (dVar16 < dVar15) {
      return;
    }
  }
  else if (dVar15 <= dVar16) goto LAB_00d3f983;
  if ((double)CONCAT44(local_128._4_4_,(float)local_128) < dVar16) {
    return;
  }
LAB_00d3f983:
  auVar31 = extraout_var_02;
  cVar46 = cbtTransform::operator()(this_01,&local_b8);
  auVar41._0_8_ = cVar46.m_floats._8_8_;
  auVar41._8_56_ = auVar43;
  auVar28._0_8_ = cVar46.m_floats._0_8_;
  auVar28._8_56_ = auVar31;
  local_80 = vunpcklpd_avx(auVar28._0_16_,auVar41._0_16_);
  auVar31 = ZEXT856(local_80._8_8_);
  cVar46 = ::operator*(&this_01->m_basis,&local_70);
  auVar42._0_8_ = cVar46.m_floats._8_8_;
  auVar42._8_56_ = auVar43;
  auVar29._0_8_ = cVar46.m_floats._0_8_;
  auVar29._8_56_ = auVar31;
  local_90 = vunpcklpd_avx(auVar29._0_16_,auVar42._0_16_);
  auVar13 = vmovshdup_avx(_local_108);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((auVar13._0_4_ - local_b8.m_floats[1]) *
                                          local_70.m_floats[1])),
                            ZEXT416((uint)(local_108._0_4_ - local_b8.m_floats[0])),
                            ZEXT416((uint)local_70.m_floats[0]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)((float)local_f8._0_4_ - local_b8.m_floats[2])),
                            ZEXT416((uint)local_70.m_floats[2]));
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  local_118 = vandps_avx512vl(auVar13,auVar8);
  fVar14 = local_118._0_4_;
  (*pcVar2->_vptr_cbtCollisionShape[0xc])(pcVar2);
  local_128._0_4_ = fVar14;
  (*local_d0->_vptr_cbtCollisionShape[0xc])();
  if (local_118._0_4_ <= fVar14 + (float)local_128) {
    local_148 = auVar13._0_8_;
    (*(resultOut->super_Result)._vptr_Result[4])(local_148,resultOut,local_90,local_80);
    cbtManifoldResult::refreshContactPoints(resultOut);
  }
  return;
}

Assistant:

void cbtArcSegmentCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                       const cbtCollisionObjectWrapper* body1,
                                                       const cbtDispatcherInfo& dispatchInfo,
                                                       cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* arcObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* segmentObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    // only 1 contact per pair, avoid persistence
    resultOut->getPersistentManifold()->clearManifold();

    const cbt2DarcShape* arc = (cbt2DarcShape*)arcObjWrap->getCollisionShape();
    const cbt2DsegmentShape* segment = (cbt2DsegmentShape*)segmentObjWrap->getCollisionShape();

    // A concave arc (i.e.with outward volume, counterclockwise abscissa) will never collide with segments
    if (arc->get_counterclock())
        return;

    const cbtTransform& m44Tarc = arcObjWrap->getCollisionObject()->getWorldTransform();
    const cbtTransform& m44Tsegment = segmentObjWrap->getCollisionObject()->getWorldTransform();

    // Shapes on two planes that are not so parallel? no collisions!
    cbtVector3 Zarc = m44Tarc.getBasis().getColumn(2);
    cbtVector3 Zsegment = m44Tsegment.getBasis().getColumn(2);
    if (fabs(Zarc.dot(Zsegment)) < 0.99)  //***TODO*** threshold as setting
        return;

    // Shapes on two planes that are too far? no collisions!
    cbtVector3 diff = m44Tsegment.invXform(m44Tarc.getOrigin());
    if (fabs(diff.getZ()) > (arc->get_zthickness() + segment->get_zthickness()))
        return;

    // vectors of body 1 in body 2 csys:
    cbtVector3 local_arc_center = m44Tsegment.invXform(m44Tarc * cbtVector3(arc->get_X(), arc->get_Y(), 0));
    cbtVector3 local_arc_X = m44Tsegment.getBasis().transpose() * (m44Tarc.getBasis() * cbtVector3(1, 0, 0));
    double local_arc_rot = atan2(local_arc_X.getY(), local_arc_X.getX());
    double arc1_angle1 = local_arc_rot + arc->get_angle1();
    double arc1_angle2 = local_arc_rot + arc->get_angle2();

    cbtVector3 local_CS1 = local_arc_center - segment->get_P1();
    cbtVector3 local_seg_S2S1 = (segment->get_P2() - segment->get_P1());
    cbtScalar seg_length = local_seg_S2S1.length();
    if (seg_length < 1e-30)
        return;
    cbtVector3 local_seg_D = local_seg_S2S1 / seg_length;
    cbtScalar param = local_CS1.dot(local_seg_D);

    // contact out of segment extrema?
    if (param < 0)
        return;
    if (param > seg_length)
        return;

    cbtVector3 local_P2 = segment->get_P1() + local_seg_D * param;
    cbtVector3 local_CP2 = local_arc_center - local_P2;
    local_CP2.setZ(0);
    cbtVector3 local_R = local_CP2.normalized() * arc->get_radius();
    cbtVector3 local_P1;
    cbtVector3 local_N2;
    if (local_seg_S2S1.cross(local_CP2).getZ() > 0) {
        local_P1 = local_arc_center - local_R;
        local_N2 = local_CP2.normalized();
    } else {
        local_P1 = local_arc_center + local_R;
        local_N2 = -local_CP2.normalized();
    }

    double alpha = atan2(-local_N2.getY(), -local_N2.getX());

    // Discard points out of min-max angles

    // to always positive angles:
    arc1_angle1 = fmod(arc1_angle1 + 1e-30, CH_C_2PI);
    if (arc1_angle1 < 0)
        arc1_angle1 += CH_C_2PI;
    arc1_angle2 = fmod(arc1_angle2 + 1e-30, CH_C_2PI);
    if (arc1_angle2 < 0)
        arc1_angle2 += CH_C_2PI;
    alpha = fmod(alpha, CH_C_2PI);
    if (alpha < 0)
        alpha += CH_C_2PI;

    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);

    alpha = fmod(alpha, CH_C_2PI);

    bool inangle1 = false;

    if (arc1_angle1 < arc1_angle2) {
        if (alpha >= arc1_angle2 || alpha <= arc1_angle1)
            inangle1 = true;
    } else {
        if (alpha >= arc1_angle2 && alpha <= arc1_angle1)
            inangle1 = true;
    }

    if (!inangle1)
        return;

    // transform in absolute coords:
    // cbtVector3 pos1 = m44Tsegment * local_P1; // not needed
    cbtVector3 pos2 = m44Tsegment * local_P2;
    cbtVector3 normal_on_2 = m44Tsegment.getBasis() * local_N2;
    cbtScalar dist = local_N2.dot(local_P1 - local_P2);

    // too far or too interpenetrate? discard.
    if (fabs(dist) > (arc->getMargin() + segment->getMargin()))
        return;

    /// report a contact. internally this will be kept persistent, and contact reduction is done
    resultOut->addContactPoint(normal_on_2, pos2, dist);

    resultOut->refreshContactPoints();
}